

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

SockAddr * sk_extractaddr_tmp(SockAddr *__return_storage_ptr__,SockAddr *addr,SockAddrStep *step)

{
  SockAddr *toret;
  SockAddrStep *step_local;
  SockAddr *addr_local;
  
  memcpy(__return_storage_ptr__,addr,0x220);
  __return_storage_ptr__->refcount = 1;
  if (addr->superfamily == IP) {
    __return_storage_ptr__->ais = step->ai;
  }
  return __return_storage_ptr__;
}

Assistant:

static SockAddr sk_extractaddr_tmp(
    SockAddr *addr, const SockAddrStep *step)
{
    SockAddr toret;
    toret = *addr;                    /* structure copy */
    toret.refcount = 1;

    if (addr->superfamily == IP) {
#ifndef NO_IPV6
        toret.ais = step->ai;
#else
        assert(SOCKADDR_FAMILY(addr, *step) == AF_INET);
        toret.addresses += step->curraddr;
#endif
    }

    return toret;
}